

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.h
# Opt level: O2

cmCommand * __thiscall cmTryRunCommand::Clone(cmTryRunCommand *this)

{
  cmTryRunCommand *this_00;
  
  this_00 = (cmTryRunCommand *)operator_new(0x158);
  cmTryRunCommand(this_00);
  return (cmCommand *)this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTryRunCommand;
    }